

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O3

void QLibraryStore::releaseLibrary(QLibraryPrivate *lib)

{
  QAtomicInt *pQVar1;
  QBasicMutex copy;
  map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
  *c;
  
  if ((AtomicType)qt_library_mutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    qt_library_mutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
  }
  else {
    QBasicMutex::lockInternal(&qt_library_mutex);
  }
  c = &qt_library_data->libraryMap;
  if (qt_library_data == (QLibraryStore *)0x0 && (qt_library_data_once & 1) == 0) {
    c = (map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
         *)operator_new(0x30);
    releaseLibrary((QLibraryStore *)c);
  }
  LOCK();
  pQVar1 = &lib->libraryRefCount;
  (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 0) goto LAB_00495069;
  if (c == (map<QString,_QLibraryPrivate_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
            *)0x0) {
    if (lib != (QLibraryPrivate *)0x0) goto LAB_00495054;
  }
  else {
    if ((lib->fileName).d.size != 0) {
      q20::
      erase_if<QString,QLibraryPrivate*,std::less<QString>,QLibraryStore::releaseLibrary(QLibraryPrivate*)::_lambda(auto:1_const&)_1_>
                (c,(anon_class_8_1_ba1d5de5)lib);
    }
LAB_00495054:
    QLibraryPrivate::~QLibraryPrivate(lib);
  }
  operator_delete(lib,0xb0);
LAB_00495069:
  copy.d_ptr._q_value._M_b._M_p = qt_library_mutex.d_ptr._q_value._M_b._M_p;
  LOCK();
  qt_library_mutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)copy.d_ptr._q_value._M_b._M_p == (AtomicType)0x1) {
    return;
  }
  QBasicMutex::unlockInternalFutex(&qt_library_mutex,(void *)copy.d_ptr._q_value._M_b._M_p);
  return;
}

Assistant:

inline void QLibraryStore::releaseLibrary(QLibraryPrivate *lib)
{
    QMutexLocker locker(&qt_library_mutex);
    QLibraryStore *data = instance();

    if (lib->libraryRefCount.deref()) {
        // still in use
        return;
    }

    // no one else is using
    Q_ASSERT(lib->libraryUnloadCount.loadRelaxed() == 0);

    if (Q_LIKELY(data) && !lib->fileName.isEmpty()) {
        using q20::erase_if;
        const auto n = erase_if(data->libraryMap, [lib](const auto &e) {
            return e.second == lib;
        });
        Q_ASSERT_X(n, "~QLibrary", "Did not find this library in the library map");
        Q_UNUSED(n);
    }
    delete lib;
}